

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlParser.cpp
# Opt level: O2

void __thiscall KDReports::Test::testSpreadSheetMode(Test *this)

{
  bool bVar1;
  char cVar2;
  QStandardItem *pQVar3;
  QObject *t1;
  QArrayDataPointer<char16_t> local_70;
  QStandardItemModel model;
  QFile file;
  Report report;
  Orientation local_1c;
  
  KDReports::Report::Report(&report,(QObject *)0x0);
  KDReports::Report::setReportMode((ReportMode)&report);
  QStandardItemModel::QStandardItemModel(&model,(QObject *)0x0);
  pQVar3 = (QStandardItem *)operator_new(0x10);
  QString::QString((QString *)&local_70,"cell1");
  QStandardItem::QStandardItem(pQVar3,(QString *)&local_70);
  QStandardItemModel::setItem((int)&model,0,(QStandardItem *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  pQVar3 = (QStandardItem *)operator_new(0x10);
  QString::QString((QString *)&local_70,"cell2");
  QStandardItem::QStandardItem(pQVar3,(QString *)&local_70);
  QStandardItemModel::setItem((int)&model,0,(QStandardItem *)0x1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  QString::QString((QString *)&local_70,"table1");
  KDReports::Report::associateModel((QString *)&report,(QAbstractItemModel *)&local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  QString::QString((QString *)&local_70,":/spreadsheet.xml");
  QFile::QFile(&file,(QString *)&local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  bVar1 = (bool)QFile::open(&file,1);
  cVar2 = QTest::qVerify(bVar1,"file.open(QIODevice::ReadOnly)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                         ,0x14e);
  if (cVar2 != '\0') {
    bVar1 = (bool)KDReports::Report::loadFromXML((QIODevice *)&report,(ErrorDetails *)&file);
    cVar2 = QTest::qVerify(bVar1,"report.loadFromXML(&file)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                           ,0x14f);
    if (cVar2 != '\0') {
      KDReports::Report::mainTable();
      KDReports::MainTable::autoTableElement();
      t1 = (QObject *)KDReports::AutoTableElement::tableModel();
      bVar1 = QTest::compare_ptr_helper
                        (t1,(QObject *)&model,"report.mainTable()->autoTableElement()->tableModel()"
                         ,"baseModel",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                         ,0x152);
      if (bVar1) {
        local_70.d._0_4_ = KDReports::Report::pageOrientation();
        local_1c = Landscape;
        QTest::qCompare<QPageLayout::Orientation,QPageLayout::Orientation>
                  ((Orientation *)&local_70,&local_1c,"report.pageOrientation()",
                   "QPageLayout::Landscape",
                   "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                   ,0x153);
      }
    }
  }
  QFile::~QFile(&file);
  QStandardItemModel::~QStandardItemModel(&model);
  KDReports::Report::~Report(&report);
  return;
}

Assistant:

void testSpreadSheetMode()
    {
        Report report;
        // TODO: make this part of the XML?
        report.setReportMode(Report::SpreadSheet);

        QStandardItemModel model;
        model.setItem(0, 0, new QStandardItem("cell1"));
        model.setItem(0, 1, new QStandardItem("cell2"));
        report.associateModel("table1", &model);

        QFile file(":/spreadsheet.xml");
        QVERIFY(file.open(QIODevice::ReadOnly));
        QVERIFY(report.loadFromXML(&file));

        QAbstractItemModel *baseModel = &model;
        QCOMPARE(report.mainTable()->autoTableElement()->tableModel(), baseModel);
        QCOMPARE(report.pageOrientation(), QPageLayout::Landscape);
    }